

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O2

bool __thiscall
HeadersSyncState::ValidateAndStoreHeadersCommitments
          (HeadersSyncState *this,vector<CBlockHeader,_std::allocator<CBlockHeader>_> *headers)

{
  long lVar1;
  pointer pCVar2;
  string_view source_file;
  bool bVar3;
  bool bVar4;
  Logger *pLVar5;
  string *b;
  arith_uint256 *b_00;
  uint256 *a;
  arith_uint256 *this_00;
  long *in_R9;
  CBlockHeader *hdr;
  pointer pCVar6;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  long *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  string local_70;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar6 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar4 = true;
  if ((headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
      super__Vector_impl_data._M_finish != pCVar6) {
    if (this->m_download_state == PRESYNC) {
      a = &pCVar6->hashPrevBlock;
      b = &log_msg;
      CBlockHeader::GetHash((uint256 *)b,&this->m_last_header_received);
      bVar3 = ::operator!=(&a->super_base_blob<256U>,(base_blob<256U> *)b);
      if (bVar3) {
        bVar4 = ::LogAcceptCategory((LogFlags)a,(Level)b);
        if (bVar4) {
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/headerssync.cpp"
          ;
          source_file_00._M_len = 0x58;
          logging_function._M_str = "ValidateAndStoreHeadersCommitments";
          logging_function._M_len = 0x22;
          LogPrintf_<long,long>
                    (logging_function,source_file_00,0x9a,
                     IPC|I2P|QT|LIBEVENT|RAND|CMPCTBLOCK|ADDRMAN|ZMQ|BENCH|HTTP|MEMPOOL|TOR|NET,
                     (Level)&this->m_id,(char *)&this->m_current_height,in_stack_ffffffffffffff18,
                     (long *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        }
      }
      else {
        pCVar6 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pCVar2 = (headers->super__Vector_base<CBlockHeader,_std::allocator<CBlockHeader>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        do {
          if (pCVar6 == pCVar2) {
            bVar3 = operator>=(&(this->m_current_chain_work).super_base_uint<256U>,
                               &(this->m_minimum_required_work).super_base_uint<256U>);
            if (bVar3) {
              std::deque<CompressedHeader,_std::allocator<CompressedHeader>_>::clear
                        (&this->m_redownloaded_headers);
              this->m_redownload_buffer_last_height = (long)this->m_chain_start->nHeight;
              CBlockIndex::GetBlockHash((uint256 *)&log_msg,this->m_chain_start);
              *(ulong *)((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data.
                         _M_elems + 0x10) =
                   CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                            log_msg.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               0x18) = log_msg.field_2._8_8_;
              *(pointer *)
               (this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems =
                   log_msg._M_dataplus._M_p;
              *(size_type *)
               ((this->m_redownload_buffer_first_prev_hash).super_base_blob<256U>.m_data._M_elems +
               8) = log_msg._M_string_length;
              CBlockIndex::GetBlockHash((uint256 *)&log_msg,this->m_chain_start);
              *(ulong *)((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems
                        + 0x10) =
                   CONCAT71(log_msg.field_2._M_allocated_capacity._1_7_,
                            log_msg.field_2._M_local_buf[0]);
              *(undefined8 *)
               ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 0x18)
                   = log_msg.field_2._8_8_;
              *(pointer *)
               (this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems =
                   log_msg._M_dataplus._M_p;
              *(size_type *)
               ((this->m_redownload_buffer_last_hash).super_base_blob<256U>.m_data._M_elems + 8) =
                   log_msg._M_string_length;
              b_00 = &this->m_chain_start->nChainWork;
              this_00 = &this->m_redownload_chain_work;
              base_uint<256U>::operator=
                        (&this_00->super_base_uint<256U>,&b_00->super_base_uint<256U>);
              this->m_download_state = REDOWNLOAD;
              bVar3 = ::LogAcceptCategory((LogFlags)this_00,(Level)b_00);
              if (bVar3) {
                pLVar5 = LogInstance();
                bVar3 = BCLog::Logger::Enabled(pLVar5);
                if (bVar3) {
                  log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
                  log_msg._M_string_length = 0;
                  log_msg.field_2._M_local_buf[0] = '\0';
                  tinyformat::format<long,long,long>
                            (&local_70,
                             (tinyformat *)
                             "Initial headers sync transition with peer=%d: reached sufficient work at height=%i, redownloading from height=%i\n"
                             ,(char *)&this->m_id,&this->m_current_height,
                             &this->m_redownload_buffer_last_height,in_R9);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&log_msg,&local_70);
                  std::__cxx11::string::~string((string *)&local_70);
                  pLVar5 = LogInstance();
                  local_70._M_dataplus._M_p = &DAT_00000058;
                  local_70._M_string_length = 0xca3033;
                  source_file._M_str =
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/headerssync.cpp"
                  ;
                  source_file._M_len = 0x58;
                  str._M_str = log_msg._M_dataplus._M_p;
                  str._M_len = log_msg._M_string_length;
                  logging_function_00._M_str = "ValidateAndStoreHeadersCommitments";
                  logging_function_00._M_len = 0x22;
                  BCLog::Logger::LogPrintStr
                            (pLVar5,str,logging_function_00,source_file,0xad,NET,Debug);
                  std::__cxx11::string::~string((string *)&log_msg);
                }
              }
            }
            goto LAB_006c5dbe;
          }
          bVar3 = ValidateAndProcessSingleHeader(this,pCVar6);
          pCVar6 = pCVar6 + 1;
        } while (bVar3);
      }
    }
    bVar4 = false;
  }
LAB_006c5dbe:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool HeadersSyncState::ValidateAndStoreHeadersCommitments(const std::vector<CBlockHeader>& headers)
{
    // The caller should not give us an empty set of headers.
    Assume(headers.size() > 0);
    if (headers.size() == 0) return true;

    Assume(m_download_state == State::PRESYNC);
    if (m_download_state != State::PRESYNC) return false;

    if (headers[0].hashPrevBlock != m_last_header_received.GetHash()) {
        // Somehow our peer gave us a header that doesn't connect.
        // This might be benign -- perhaps our peer reorged away from the chain
        // they were on. Give up on this sync for now (likely we will start a
        // new sync with a new starting point).
        LogDebug(BCLog::NET, "Initial headers sync aborted with peer=%d: non-continuous headers at height=%i (presync phase)\n", m_id, m_current_height);
        return false;
    }

    // If it does connect, (minimally) validate and occasionally store
    // commitments.
    for (const auto& hdr : headers) {
        if (!ValidateAndProcessSingleHeader(hdr)) {
            return false;
        }
    }

    if (m_current_chain_work >= m_minimum_required_work) {
        m_redownloaded_headers.clear();
        m_redownload_buffer_last_height = m_chain_start->nHeight;
        m_redownload_buffer_first_prev_hash = m_chain_start->GetBlockHash();
        m_redownload_buffer_last_hash = m_chain_start->GetBlockHash();
        m_redownload_chain_work = m_chain_start->nChainWork;
        m_download_state = State::REDOWNLOAD;
        LogDebug(BCLog::NET, "Initial headers sync transition with peer=%d: reached sufficient work at height=%i, redownloading from height=%i\n", m_id, m_current_height, m_redownload_buffer_last_height);
    }
    return true;
}